

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O2

bool __thiscall
crnlib::command_line_params::parse
          (command_line_params *this,dynamic_string_array *params,uint n,param_desc *pParam_desc)

{
  uint16 uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  bool *pbVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  dynamic_string *pdVar10;
  bool bVar11;
  int8 local_1cc;
  dynamic_string key_str;
  dynamic_string_array local_1a8;
  dynamic_string filename;
  param_value local_150;
  dynamic_string val_str [16];
  
  vector<crnlib::dynamic_string>::operator=(&this->m_params,params);
  uVar4 = 0;
  do {
    while( true ) {
      do {
        uVar2 = uVar4;
        bVar11 = params->m_size <= uVar2;
        if (bVar11) {
          return true;
        }
        uVar4 = uVar2 + 1;
        uVar1 = params->m_p[uVar2].m_len;
      } while (uVar1 == 0);
      pdVar10 = params->m_p + uVar2;
      pcVar7 = pdVar10->m_pStr;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "";
      }
      if (*pcVar7 == '-') break;
      filename.m_buf_size = 0;
      filename.m_len = 0;
      filename._4_4_ = 0;
      filename.m_pStr._0_4_ = 0;
      filename.m_pStr._4_4_ = 0;
      vector<crnlib::dynamic_string>::push_back((vector<crnlib::dynamic_string> *)&filename,pdVar10)
      ;
      dynamic_string::unquote
                ((dynamic_string *)((ulong)((int)filename.m_pStr - 1) * 0x10 + filename._0_8_));
      std::pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>::
      pair<crnlib::dynamic_string_&,_crnlib::command_line_params::param_value_&,_true>
                ((pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> *)val_str,
                 (dynamic_string *)g_empty_dynamic_string,(param_value *)&filename);
      std::
      _Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
      ::_M_emplace_equal<std::pair<crnlib::dynamic_string,crnlib::command_line_params::param_value>>
                ((_Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
                  *)&this->m_param_map,
                 (pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> *)val_str);
      std::pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>::~pair
                ((pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> *)val_str);
      vector<crnlib::dynamic_string>::~vector((vector<crnlib::dynamic_string> *)&filename);
    }
    if (uVar1 == 1) {
      console::error("Invalid command line parameter: \"%s\"");
      return false;
    }
    dynamic_string::dynamic_string(&key_str,pdVar10);
    dynamic_string::right(&key_str,1);
    pcVar7 = key_str.m_pStr;
    if (key_str.m_pStr == (char *)0x0) {
      pcVar7 = "";
    }
    pbVar6 = &pParam_desc->m_support_listing_file;
    uVar8 = (ulong)n;
    if (pcVar7[key_str.m_len - 1] == '+') {
      local_1cc = '\x01';
LAB_0010cc16:
      dynamic_string::left(&key_str,key_str.m_len - 1);
    }
    else {
      if (pcVar7[key_str.m_len - 1] == '-') {
        local_1cc = -1;
        goto LAB_0010cc16;
      }
      local_1cc = '\0';
    }
LAB_0010cc3e:
    if (uVar8 != 0) {
      bVar3 = dynamic_string::operator==(&key_str,((param_desc *)(pbVar6 + -0xc))->m_pName);
      if (!bVar3) break;
      if ((int)uVar8 != 0) {
        lVar5 = 0;
        do {
          *(undefined4 *)((long)&val_str[0].m_buf_size + lVar5) = 0;
          *(undefined8 *)((long)&val_str[0].m_pStr + lVar5) = 0;
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x100);
        uVar9 = *(uint *)(pbVar6 + -4);
        uVar8 = (ulong)uVar9;
        if (uVar9 == 0) {
          uVar8 = 0;
LAB_0010cd3f:
          local_1a8.m_p = (dynamic_string *)0x0;
          local_1a8.m_size = 0;
          local_1a8.m_capacity = 0;
          if ((*pbVar6 == true) && (1 < val_str[0].m_len)) {
            pcVar7 = val_str[0].m_pStr;
            if (val_str[0].m_pStr == (char *)0x0) {
              pcVar7 = "";
            }
            if (*pcVar7 != '@') goto LAB_0010ce79;
            dynamic_string::dynamic_string(&filename,val_str);
            dynamic_string::right(&filename,1);
            dynamic_string::unquote(&filename);
            pcVar7 = (char *)CONCAT44(filename.m_pStr._4_4_,(int)filename.m_pStr);
            if (pcVar7 == (char *)0x0) {
              pcVar7 = "";
            }
            bVar3 = load_string_file(pcVar7,&local_1a8);
            if (bVar3) {
              dynamic_string::~dynamic_string(&filename);
              goto LAB_0010cdc9;
            }
            pcVar7 = (char *)CONCAT44(filename.m_pStr._4_4_,(int)filename.m_pStr);
            if (pcVar7 == (char *)0x0) {
              pcVar7 = "";
            }
            console::error("Failed loading listing file \"%s\"!",pcVar7);
            dynamic_string::~dynamic_string(&filename);
            bVar3 = false;
          }
          else {
LAB_0010ce79:
            pdVar10 = val_str;
            while (bVar3 = uVar8 != 0, uVar8 = uVar8 - 1, bVar3) {
              dynamic_string::unquote(pdVar10);
              vector<crnlib::dynamic_string>::push_back(&local_1a8,pdVar10);
              pdVar10 = pdVar10 + 1;
            }
LAB_0010cdc9:
            local_150.m_values.m_p = local_1a8.m_p;
            local_150.m_values.m_size = local_1a8.m_size;
            local_150.m_values.m_capacity = local_1a8.m_capacity;
            local_1a8.m_p = (dynamic_string *)0x0;
            local_1a8.m_size = 0;
            local_1a8.m_capacity = 0;
            local_150.m_modifier = local_1cc;
            local_150.m_index = uVar2;
            std::pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>::
            pair<crnlib::dynamic_string_&,_crnlib::command_line_params::param_value_&,_true>
                      ((pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> *)
                       &filename,&key_str,&local_150);
            std::
            _Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
            ::
            _M_emplace_equal<std::pair<crnlib::dynamic_string,crnlib::command_line_params::param_value>>
                      ((_Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
                        *)&this->m_param_map,
                       (pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> *)
                       &filename);
            std::pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>::~pair
                      ((pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> *)
                       &filename);
            vector<crnlib::dynamic_string>::~vector(&local_150.m_values);
            bVar3 = true;
          }
          vector<crnlib::dynamic_string>::~vector(&local_1a8);
        }
        else {
          if (uVar9 + uVar4 <= params->m_size) {
            pdVar10 = val_str;
            for (uVar9 = 0; uVar9 < (uint)uVar8; uVar9 = uVar9 + 1) {
              dynamic_string::operator=(pdVar10,params->m_p + (uVar4 + uVar9));
              uVar8 = (ulong)*(uint *)(pbVar6 + -4);
              pdVar10 = pdVar10 + 1;
            }
            uVar8 = (ulong)uVar9;
            uVar4 = uVar4 + uVar9;
            goto LAB_0010cd3f;
          }
          pcVar7 = pdVar10->m_pStr;
          if (pcVar7 == (char *)0x0) {
            pcVar7 = "";
          }
          bVar3 = false;
          console::error("Expected %u value(s) after command line parameter: \"%s\"",uVar8,pcVar7);
        }
        lVar5 = 0xf0;
        do {
          dynamic_string::~dynamic_string((dynamic_string *)((long)&val_str[0].m_buf_size + lVar5));
          lVar5 = lVar5 + -0x10;
        } while (lVar5 != -0x10);
        goto LAB_0010ce60;
      }
    }
    pcVar7 = pdVar10->m_pStr;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    bVar3 = false;
    console::error("Unrecognized command line parameter: \"%s\"",pcVar7);
LAB_0010ce60:
    dynamic_string::~dynamic_string(&key_str);
    if (!bVar3) {
      return bVar11;
    }
  } while( true );
  pbVar6 = pbVar6 + 0x10;
  uVar8 = uVar8 - 1;
  goto LAB_0010cc3e;
}

Assistant:

bool command_line_params::parse(const dynamic_string_array& params, uint n, const param_desc* pParam_desc)
    {
        CRNLIB_ASSERT(n && pParam_desc);

        m_params = params;

        uint arg_index = 0;
        while (arg_index < params.size())
        {
            const uint cur_arg_index = arg_index;
            const dynamic_string& src_param = params[arg_index++];

            if (src_param.is_empty())
            {
                continue;
            }
#if CRNLIB_CMD_LINE_ALLOW_SLASH_PARAMS
            if ((src_param[0] == '/') || (src_param[0] == '-'))
#else
            if (src_param[0] == '-')
#endif
            {
                if (src_param.get_len() < 2)
                {
                    console::error("Invalid command line parameter: \"%s\"", src_param.get_ptr());
                    return false;
                }

                dynamic_string key_str(src_param);

                key_str.right(1);

                int modifier = 0;
                char c = key_str[key_str.get_len() - 1];
                if (c == '+')
                {
                    modifier = 1;
                }
                else if (c == '-')
                {
                    modifier = -1;
                }
                if (modifier)
                {
                    key_str.left(key_str.get_len() - 1);
                }
                uint param_index;
                for (param_index = 0; param_index < n; param_index++)
                {
                    if (key_str == pParam_desc[param_index].m_pName)
                    {
                        break;
                    }
                }

                if (param_index == n)
                {
                    console::error("Unrecognized command line parameter: \"%s\"", src_param.get_ptr());
                    return false;
                }

                const param_desc& desc = pParam_desc[param_index];

                const uint cMaxValues = 16;
                dynamic_string val_str[cMaxValues];
                uint num_val_strs = 0;
                if (desc.m_num_values)
                {
                    CRNLIB_ASSERT(desc.m_num_values <= cMaxValues);

                    if ((arg_index + desc.m_num_values) > params.size())
                    {
                        console::error("Expected %u value(s) after command line parameter: \"%s\"", desc.m_num_values, src_param.get_ptr());
                        return false;
                    }

                    for (uint v = 0; v < desc.m_num_values; v++)
                    {
                        val_str[num_val_strs++] = params[arg_index++];
                    }
                }

                dynamic_string_array strings;

                if ((desc.m_support_listing_file) && (val_str[0].get_len() >= 2) && (val_str[0][0] == '@'))
                {
                    dynamic_string filename(val_str[0]);
                    filename.right(1);
                    filename.unquote();

                    if (!load_string_file(filename.get_ptr(), strings))
                    {
                        console::error("Failed loading listing file \"%s\"!", filename.get_ptr());
                        return false;
                    }
                }
                else
                {
                    for (uint v = 0; v < num_val_strs; v++)
                    {
                        val_str[v].unquote();
                        strings.push_back(val_str[v]);
                    }
                }

                param_value pv;
                pv.m_values.swap(strings);
                pv.m_index = cur_arg_index;
                pv.m_modifier = (int8)modifier;
                m_param_map.insert(std::make_pair(key_str, pv));
            }
            else
            {
                param_value pv;
                pv.m_values.push_back(src_param);
                pv.m_values.back().unquote();
                pv.m_index = cur_arg_index;
                m_param_map.insert(std::make_pair(g_empty_dynamic_string, pv));
            }
        }

        return true;
    }